

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkdecoder.c
# Opt level: O1

LPStatus XPKDecoder_RGBAToPNG(uint8_t *rgba,XPKEntry *entry,char *path)

{
  int iVar1;
  
  iVar1 = stbi_write_png(path,(uint)entry->width,(uint)entry->height,4,rgba,(uint)entry->width * 4);
  if (iVar1 == 0) {
    LPWarn("xpk","stbi_write_png() failed: %d",0);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

LPStatus
XPKDecoder_RGBAToPNG(const uint8_t *rgba, const XPKEntry *entry, const char *path)
{
	int status = stbi_write_png(path, entry->width, entry->height, 4, rgba, entry->width*4);
	if (status) {
		return LUNAPURPURA_OK;
	} else {
		LPWarn(LP_SUBSYSTEM_XPK, "stbi_write_png() failed: %d", status);
		return LUNAPURPURA_ERROR;
	}
}